

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DetonationPdu.cpp
# Opt level: O1

void __thiscall DIS::DetonationPdu::~DetonationPdu(DetonationPdu *this)

{
  pointer pAVar1;
  pointer pAVar2;
  pointer pAVar3;
  
  (this->super_WarfareFamilyPdu).super_Pdu._vptr_Pdu = (_func_int **)&PTR__DetonationPdu_0019faa8;
  pAVar1 = (this->_articulationParameters).
           super__Vector_base<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pAVar2 = (this->_articulationParameters).
           super__Vector_base<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pAVar3 = pAVar1;
  if (pAVar2 != pAVar1) {
    do {
      (**pAVar3->_vptr_ArticulationParameter)(pAVar3);
      pAVar3 = pAVar3 + 1;
    } while (pAVar3 != pAVar2);
    (this->_articulationParameters).
    super__Vector_base<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>.
    _M_impl.super__Vector_impl_data._M_finish = pAVar1;
  }
  std::vector<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>::~vector
            (&this->_articulationParameters);
  Vector3Float::~Vector3Float(&this->_locationInEntityCoordinates);
  BurstDescriptor::~BurstDescriptor(&this->_burstDescriptor);
  Vector3Double::~Vector3Double(&this->_locationInWorldCoordinates);
  Vector3Float::~Vector3Float(&this->_velocity);
  EventID::~EventID(&this->_eventID);
  EntityID::~EntityID(&this->_munitionID);
  WarfareFamilyPdu::~WarfareFamilyPdu(&this->super_WarfareFamilyPdu);
  return;
}

Assistant:

DetonationPdu::~DetonationPdu()
{
    _articulationParameters.clear();
}